

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void __thiscall booster::locale::impl_icu::num_parse<wchar_t>::~num_parse(num_parse<wchar_t> *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__num_parse_001d2510;
  pcVar1 = (this->enc_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->enc_).field_2) {
    operator_delete(pcVar1);
  }
  icu_70::Locale::~Locale(&this->loc_);
  std::locale::facet::~facet((facet *)this);
  operator_delete(this);
  return;
}

Assistant:

num_parse(cdata const &d,size_t refs = 0) : 
        std::num_get<CharType>(refs),
        loc_(d.locale),
        enc_(d.encoding)
    {
    }